

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalCommonGenerator.cxx
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
* __thiscall
cmGlobalCommonGenerator::ComputeDirectoryTargets_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
           *__return_storage_ptr__,cmGlobalCommonGenerator *this)

{
  string_view val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  LocalGeneratorVector *this_01;
  pointer pcVar2;
  cmMakefile *this_02;
  GeneratorTargetVector *this_03;
  reference this_04;
  pointer pcVar3;
  mapped_type *pmVar4;
  string *psVar5;
  allocator<char> local_391;
  string local_390;
  cmStateDirectory local_370;
  cmStateDirectory local_348;
  undefined1 local_320 [8];
  Dir d_1;
  cmStateSnapshot *state;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_2c8;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *local_2b0;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range2_1;
  cmStateDirectory local_290;
  string *local_268;
  string *d;
  undefined1 local_248 [8];
  cmStateSnapshot dir;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  string *config;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  cmValue exclude;
  undefined1 local_128 [8];
  string EXCLUDE_FROM_ALL;
  Target t;
  TargetType type;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  DirectoryTarget *dirTarget;
  cmStateSnapshot local_88;
  cmStateDirectory local_70;
  string *local_48;
  string *currentBinaryDir;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalCommonGenerator *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  *dirTargets;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  ::map(__return_storage_ptr__);
  this_01 = &(this->super_cmGlobalGenerator).LocalGenerators;
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(this_01);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&lg), bVar1) {
    currentBinaryDir =
         (string *)
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
         ::operator*(&__end1);
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        currentBinaryDir);
    cmLocalGenerator::GetStateSnapshot(&local_88,pcVar2);
    cmStateSnapshot::GetDirectory(&local_70,&local_88);
    local_48 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_70);
    configs = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                 ::operator[](__return_storage_ptr__,local_48);
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        currentBinaryDir);
    (configs->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar2;
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        currentBinaryDir);
    this_02 = cmLocalGenerator::GetMakefile(pcVar2);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,this_02,IncludeEmptyConfig);
    local_a8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2;
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        currentBinaryDir);
    this_03 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(this_03);
    gt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
         std::
         vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
         ::end(this_03);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&gt), bVar1) {
      this_04 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                ::operator*(&__end2);
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_04);
      t.ExcludedFromAllInConfigs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = cmGeneratorTarget::GetType(pcVar3);
      if (t.ExcludedFromAllInConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != GLOBAL_TARGET) {
        pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->(this_04);
        bVar1 = cmGeneratorTarget::IsInBuildSystem(pcVar3);
        if (bVar1) {
          DirectoryTarget::Target::Target((Target *)((long)&EXCLUDE_FROM_ALL.field_2 + 8));
          EXCLUDE_FROM_ALL.field_2._8_8_ =
               std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                         (this_04);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_128,"EXCLUDE_FROM_ALL",
                     (allocator<char> *)((long)&exclude.Value + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&exclude.Value + 7));
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->(this_04);
          __range4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)cmGeneratorTarget::GetProperty(pcVar3,(string *)local_128);
          bVar1 = cmValue::operator_cast_to_bool((cmValue *)&__range4);
          this_00 = local_a8;
          if (bVar1) {
            __end4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(local_a8);
            config = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(this_00);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&config), bVar1) {
              genexInterpreter.Language.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end4);
              pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                       get((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                           currentBinaryDir);
              std::__cxx11::string::string
                        ((string *)&local_1e0,(string *)genexInterpreter.Language.field_2._8_8_);
              pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       get(this_04);
              std::__cxx11::string::string((string *)&local_200);
              cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                        ((cmGeneratorExpressionInterpreter *)local_1c0,pcVar2,&local_1e0,pcVar3,
                         &local_200);
              std::__cxx11::string::~string((string *)&local_200);
              std::__cxx11::string::~string((string *)&local_1e0);
              psVar5 = cmValue::operator*[abi_cxx11_((cmValue *)&__range4);
              std::__cxx11::string::string((string *)&dir.Position.Position,(string *)psVar5);
              psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                                 ((cmGeneratorExpressionInterpreter *)local_1c0,
                                  (string *)&dir.Position.Position,(string *)local_128);
              val = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
              bVar1 = cmIsOn(val);
              std::__cxx11::string::~string((string *)&dir.Position.Position);
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&t,(value_type *)genexInterpreter.Language.field_2._8_8_);
              }
              cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
                        ((cmGeneratorExpressionInterpreter *)local_1c0);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4);
            }
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&t);
            if (bVar1) {
              pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                       operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                   *)currentBinaryDir);
              cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&d,pcVar2);
              cmStateSnapshot::GetBuildsystemDirectoryParent
                        ((cmStateSnapshot *)local_248,(cmStateSnapshot *)&d);
              while (bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_248), bVar1) {
                cmStateSnapshot::GetDirectory(&local_290,(cmStateSnapshot *)local_248);
                local_268 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_290);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                         ::operator[](__return_storage_ptr__,local_268);
                std::
                vector<cmGlobalCommonGenerator::DirectoryTarget::Target,std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>>
                ::emplace_back<cmGlobalCommonGenerator::DirectoryTarget::Target&>
                          ((vector<cmGlobalCommonGenerator::DirectoryTarget::Target,std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>>
                            *)&pmVar4->Targets,(Target *)((long)&EXCLUDE_FROM_ALL.field_2 + 8));
                cmStateSnapshot::GetBuildsystemDirectoryParent
                          ((cmStateSnapshot *)&__range2_1,(cmStateSnapshot *)local_248);
              }
            }
          }
          std::
          vector<cmGlobalCommonGenerator::DirectoryTarget::Target,std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>>
          ::emplace_back<cmGlobalCommonGenerator::DirectoryTarget::Target&>
                    ((vector<cmGlobalCommonGenerator::DirectoryTarget::Target,std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>>
                      *)&(configs->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,
                     (Target *)((long)&EXCLUDE_FROM_ALL.field_2 + 8));
          std::__cxx11::string::~string((string *)local_128);
          DirectoryTarget::Target::~Target((Target *)((long)&EXCLUDE_FROM_ALL.field_2 + 8));
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        currentBinaryDir);
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&__begin2_1,pcVar2);
    cmStateSnapshot::GetChildren(&local_2c8,(cmStateSnapshot *)&__begin2_1);
    local_2b0 = &local_2c8;
    __end2_1 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(local_2b0);
    state = (cmStateSnapshot *)
            std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(local_2b0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                               *)&state), bVar1) {
      d_1._32_8_ = __gnu_cxx::
                   __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                   ::operator*(&__end2_1);
      DirectoryTarget::Dir::Dir((Dir *)local_320);
      cmStateSnapshot::GetDirectory(&local_348,(cmStateSnapshot *)d_1._32_8_);
      psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_348);
      std::__cxx11::string::operator=((string *)local_320,(string *)psVar5);
      cmStateSnapshot::GetDirectory(&local_370,(cmStateSnapshot *)d_1._32_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"EXCLUDE_FROM_ALL",&local_391);
      d_1.Path.field_2._M_local_buf[8] = cmStateDirectory::GetPropertyAsBool(&local_370,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator(&local_391);
      std::
      vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
      ::emplace_back<cmGlobalCommonGenerator::DirectoryTarget::Dir>
                ((vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                  *)&configs[1].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Dir *)local_320);
      DirectoryTarget::Dir::~Dir((Dir *)local_320);
      __gnu_cxx::
      __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector(&local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cmGlobalCommonGenerator::DirectoryTarget>
cmGlobalCommonGenerator::ComputeDirectoryTargets() const
{
  std::map<std::string, DirectoryTarget> dirTargets;
  for (const auto& lg : this->LocalGenerators) {
    std::string const& currentBinaryDir(
      lg->GetStateSnapshot().GetDirectory().GetCurrentBinary());
    DirectoryTarget& dirTarget = dirTargets[currentBinaryDir];
    dirTarget.LG = lg.get();
    const std::vector<std::string>& configs =
      lg->GetMakefile()->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

    // The directory-level rule should depend on the target-level rules
    // for all targets in the directory.
    for (const auto& gt : lg->GetGeneratorTargets()) {
      cmStateEnums::TargetType const type = gt->GetType();
      if (type == cmStateEnums::GLOBAL_TARGET || !gt->IsInBuildSystem()) {
        continue;
      }
      DirectoryTarget::Target t;
      t.GT = gt.get();
      const std::string EXCLUDE_FROM_ALL("EXCLUDE_FROM_ALL");
      if (cmValue exclude = gt->GetProperty(EXCLUDE_FROM_ALL)) {
        for (const std::string& config : configs) {
          cmGeneratorExpressionInterpreter genexInterpreter(lg.get(), config,
                                                            gt.get());
          if (cmIsOn(genexInterpreter.Evaluate(*exclude, EXCLUDE_FROM_ALL))) {
            // This target has been explicitly excluded.
            t.ExcludedFromAllInConfigs.push_back(config);
          }
        }

        if (t.ExcludedFromAllInConfigs.empty()) {
          // This target has been explicitly un-excluded.  The directory-level
          // rule for every directory between this and the root should depend
          // on the target-level rule for this target.
          for (cmStateSnapshot dir =
                 lg->GetStateSnapshot().GetBuildsystemDirectoryParent();
               dir.IsValid(); dir = dir.GetBuildsystemDirectoryParent()) {
            std::string const& d = dir.GetDirectory().GetCurrentBinary();
            dirTargets[d].Targets.emplace_back(t);
          }
        }
      }
      dirTarget.Targets.emplace_back(t);
    }

    // The directory-level rule should depend on the directory-level
    // rules of the subdirectories.
    for (cmStateSnapshot const& state : lg->GetStateSnapshot().GetChildren()) {
      DirectoryTarget::Dir d;
      d.Path = state.GetDirectory().GetCurrentBinary();
      d.ExcludeFromAll =
        state.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL");
      dirTarget.Children.emplace_back(std::move(d));
    }
  }

  return dirTargets;
}